

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int isoent_find_out_boot_file(archive_write *a,isoent *rootent)

{
  void *pvVar1;
  isoent *piVar2;
  iso9660_conflict *iso9660;
  isoent *rootent_local;
  archive_write *a_local;
  
  pvVar1 = a->format_data;
  piVar2 = isoent_find_entry(rootent,*(char **)((long)pvVar1 + 0x10328));
  *(isoent **)((long)pvVar1 + 0x10340) = piVar2;
  if (*(long *)((long)pvVar1 + 0x10340) == 0) {
    archive_set_error(&a->archive,-1,"Can\'t find the boot image file ``%s\'\'",
                      *(undefined8 *)((long)pvVar1 + 0x10328));
    a_local._4_4_ = -0x1e;
  }
  else {
    *(undefined4 *)(*(long *)(*(long *)((long)pvVar1 + 0x10340) + 0x18) + 0xbc) = 2;
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int
isoent_find_out_boot_file(struct archive_write *a, struct isoent *rootent)
{
	struct iso9660 *iso9660 = a->format_data;

	/* Find a isoent of the boot file. */
	iso9660->el_torito.boot = isoent_find_entry(rootent,
	    iso9660->el_torito.boot_filename.s);
	if (iso9660->el_torito.boot == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Can't find the boot image file ``%s''",
		    iso9660->el_torito.boot_filename.s);
		return (ARCHIVE_FATAL);
	}
	iso9660->el_torito.boot->file->boot = BOOT_IMAGE;
	return (ARCHIVE_OK);
}